

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O2

void o3dgc::CubeToSphere(Real a,Real b,char index,Real *x,Real *y,Real *z)

{
  undefined7 in_register_00000039;
  float fVar1;
  
  switch(CONCAT71(in_register_00000039,index) & 0xffffffff) {
  case 0:
    *x = a;
    *y = b;
    fVar1 = (1.0 - *x * *x) - b * b;
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    fVar1 = SQRT(fVar1);
    break;
  case 1:
    *x = -a;
    *y = -b;
    fVar1 = (1.0 - *x * *x) - b * b;
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    fVar1 = -SQRT(fVar1);
    break;
  case 2:
    *z = a;
    *x = b;
    fVar1 = (1.0 - b * b) - *z * *z;
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    fVar1 = SQRT(fVar1);
    goto LAB_0056dfbf;
  case 3:
    *z = -a;
    *x = -b;
    fVar1 = (1.0 - b * b) - *z * *z;
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    fVar1 = -SQRT(fVar1);
LAB_0056dfbf:
    *y = fVar1;
    return;
  case 4:
    *y = a;
    *z = b;
    fVar1 = (1.0 - *y * *y) - b * b;
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    fVar1 = SQRT(fVar1);
    goto LAB_0056e067;
  case 5:
    *y = -a;
    *z = -b;
    fVar1 = (1.0 - *y * *y) - b * b;
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    fVar1 = -SQRT(fVar1);
LAB_0056e067:
    *x = fVar1;
    return;
  default:
    goto switchD_0056deae_default;
  }
  *z = fVar1;
switchD_0056deae_default:
  return;
}

Assistant:

inline void CubeToSphere(const Real a, const Real b, const char index,
                             Real & x, Real & y, Real & z)
    {
        switch( index )
        {
        case 0:
            x = a;
            y = b;
            z =  (Real) sqrt(max(0.0, 1.0 - x*x-y*y));
            break;
        case 1:
            x = -a;
            y = -b;
            z = -(Real) sqrt(max(0.0, 1.0 - x*x-y*y));
            break;
        case 2:
            z = a;
            x = b;
            y =  (Real) sqrt(max(0.0, 1.0 - x*x-z*z));
            break;
        case 3:
            z = -a;
            x = -b;
            y = -(Real) sqrt(max(0.0, 1.0 - x*x-z*z));
            break;
        case 4:
            y = a;
            z = b;
            x =  (Real) sqrt(max(0.0, 1.0 - y*y-z*z));
            break;
        case 5:
            y = -a;
            z = -b;
            x = -(Real) sqrt(max(0.0, 1.0 - y*y-z*z));
            break;
        }
    }